

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void compress(uint64_t *state,uint8_t *buf)

{
  uint64_t uVar1;
  long lVar2;
  long in_RSI;
  ulong *in_RDI;
  int i;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t t;
  uint64_t W [80];
  int local_2e4;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  uint64_t uStack_298;
  ulong local_290;
  uint64_t auStack_288 [12];
  ulong auStack_228 [2];
  uint64_t auStack_218 [65];
  long local_10;
  ulong *local_8;
  
  local_2a8 = *in_RDI;
  local_2b0 = in_RDI[1];
  local_2b8 = in_RDI[2];
  local_2c0 = in_RDI[3];
  local_2c8 = in_RDI[4];
  local_2d0 = in_RDI[5];
  local_2d8 = in_RDI[6];
  local_2e0 = in_RDI[7];
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2e4 = 0; local_2e4 < 0x10; local_2e4 = local_2e4 + 1) {
    uVar1 = load_be64((uint8_t *)(local_10 + (local_2e4 << 3)));
    (&uStack_298)[local_2e4] = uVar1;
  }
  for (local_2e4 = 0x10; local_2e4 < 0x50; local_2e4 = local_2e4 + 1) {
    (&uStack_298)[local_2e4] =
         (&uStack_298)[local_2e4 + -0x10] +
         (((&uStack_298)[local_2e4 + -0xf] >> 1 | (&uStack_298)[local_2e4 + -0xf] << 0x3f) ^
          ((&uStack_298)[local_2e4 + -0xf] >> 8 | (&uStack_298)[local_2e4 + -0xf] << 0x38) ^
         (&uStack_298)[local_2e4 + -0xf] >> 7) + (&uStack_298)[local_2e4 + -7] +
         (((&uStack_298)[local_2e4 + -2] >> 0x13 | (&uStack_298)[local_2e4 + -2] << 0x2d) ^
          ((&uStack_298)[local_2e4 + -2] >> 0x3d | (&uStack_298)[local_2e4 + -2] << 3) ^
         (&uStack_298)[local_2e4 + -2] >> 6);
  }
  for (local_2e4 = 0; local_2e4 < 0x50; local_2e4 = local_2e4 + 8) {
    lVar2 = local_2e0 +
            ((local_2c8 >> 0xe | local_2c8 << 0x32) ^ (local_2c8 >> 0x12 | local_2c8 << 0x2e) ^
            (local_2c8 >> 0x29 | local_2c8 << 0x17)) +
            (local_2d8 ^ local_2c8 & (local_2d0 ^ local_2d8)) + round_key[local_2e4] +
            (&uStack_298)[local_2e4];
    local_2c0 = lVar2 + local_2c0;
    local_2e0 = lVar2 + ((local_2a8 >> 0x1c | local_2a8 << 0x24) ^
                         (local_2a8 >> 0x22 | local_2a8 << 0x1e) ^
                        (local_2a8 >> 0x27 | local_2a8 << 0x19)) +
                ((local_2a8 | local_2b0) & local_2b8 | local_2a8 & local_2b0);
    lVar2 = local_2d8 +
            ((local_2c0 >> 0xe | local_2c0 << 0x32) ^ (local_2c0 >> 0x12 | local_2c0 << 0x2e) ^
            (local_2c0 >> 0x29 | local_2c0 * 0x800000)) +
            (local_2d0 ^ local_2c0 & (local_2c8 ^ local_2d0)) + round_key[local_2e4 + 1] +
            (&uStack_298)[local_2e4 + 1];
    local_2b8 = lVar2 + local_2b8;
    local_2d8 = lVar2 + ((local_2e0 >> 0x1c | local_2e0 << 0x24) ^
                         (local_2e0 >> 0x22 | local_2e0 * 0x40000000) ^
                        (local_2e0 >> 0x27 | local_2e0 * 0x2000000)) +
                ((local_2e0 | local_2a8) & local_2b0 | local_2e0 & local_2a8);
    lVar2 = local_2d0 +
            ((local_2b8 >> 0xe | local_2b8 << 0x32) ^ (local_2b8 >> 0x12 | local_2b8 << 0x2e) ^
            (local_2b8 >> 0x29 | local_2b8 * 0x800000)) +
            (local_2c8 ^ local_2b8 & (local_2c0 ^ local_2c8)) + round_key[local_2e4 + 2] +
            (&uStack_298)[local_2e4 + 2];
    local_2b0 = lVar2 + local_2b0;
    local_2d0 = lVar2 + ((local_2d8 >> 0x1c | local_2d8 << 0x24) ^
                         (local_2d8 >> 0x22 | local_2d8 * 0x40000000) ^
                        (local_2d8 >> 0x27 | local_2d8 * 0x2000000)) +
                ((local_2d8 | local_2e0) & local_2a8 | local_2d8 & local_2e0);
    lVar2 = local_2c8 +
            ((local_2b0 >> 0xe | local_2b0 << 0x32) ^ (local_2b0 >> 0x12 | local_2b0 << 0x2e) ^
            (local_2b0 >> 0x29 | local_2b0 * 0x800000)) +
            (local_2c0 ^ local_2b0 & (local_2b8 ^ local_2c0)) + round_key[local_2e4 + 3] +
            (&uStack_298)[local_2e4 + 3];
    local_2a8 = lVar2 + local_2a8;
    local_2c8 = lVar2 + ((local_2d0 >> 0x1c | local_2d0 << 0x24) ^
                         (local_2d0 >> 0x22 | local_2d0 * 0x40000000) ^
                        (local_2d0 >> 0x27 | local_2d0 * 0x2000000)) +
                ((local_2d0 | local_2d8) & local_2e0 | local_2d0 & local_2d8);
    lVar2 = local_2c0 +
            ((local_2a8 >> 0xe | local_2a8 << 0x32) ^ (local_2a8 >> 0x12 | local_2a8 << 0x2e) ^
            (local_2a8 >> 0x29 | local_2a8 * 0x800000)) +
            (local_2b8 ^ local_2a8 & (local_2b0 ^ local_2b8)) + round_key[local_2e4 + 4] +
            (&uStack_298)[local_2e4 + 4];
    local_2e0 = lVar2 + local_2e0;
    local_2c0 = lVar2 + ((local_2c8 >> 0x1c | local_2c8 << 0x24) ^
                         (local_2c8 >> 0x22 | local_2c8 * 0x40000000) ^
                        (local_2c8 >> 0x27 | local_2c8 * 0x2000000)) +
                ((local_2c8 | local_2d0) & local_2d8 | local_2c8 & local_2d0);
    lVar2 = local_2b8 +
            ((local_2e0 >> 0xe | local_2e0 << 0x32) ^ (local_2e0 >> 0x12 | local_2e0 << 0x2e) ^
            (local_2e0 >> 0x29 | local_2e0 * 0x800000)) +
            (local_2b0 ^ local_2e0 & (local_2a8 ^ local_2b0)) + round_key[local_2e4 + 5] +
            (&uStack_298)[local_2e4 + 5];
    local_2d8 = lVar2 + local_2d8;
    local_2b8 = lVar2 + ((local_2c0 >> 0x1c | local_2c0 << 0x24) ^
                         (local_2c0 >> 0x22 | local_2c0 * 0x40000000) ^
                        (local_2c0 >> 0x27 | local_2c0 * 0x2000000)) +
                ((local_2c0 | local_2c8) & local_2d0 | local_2c0 & local_2c8);
    lVar2 = local_2b0 +
            ((local_2d8 >> 0xe | local_2d8 << 0x32) ^ (local_2d8 >> 0x12 | local_2d8 << 0x2e) ^
            (local_2d8 >> 0x29 | local_2d8 * 0x800000)) +
            (local_2a8 ^ local_2d8 & (local_2e0 ^ local_2a8)) + round_key[local_2e4 + 6] +
            (&uStack_298)[local_2e4 + 6];
    local_2d0 = lVar2 + local_2d0;
    local_2b0 = lVar2 + ((local_2b8 >> 0x1c | local_2b8 << 0x24) ^
                         (local_2b8 >> 0x22 | local_2b8 * 0x40000000) ^
                        (local_2b8 >> 0x27 | local_2b8 * 0x2000000)) +
                ((local_2b8 | local_2c0) & local_2c8 | local_2b8 & local_2c0);
    lVar2 = local_2a8 +
            ((local_2d0 >> 0xe | local_2d0 << 0x32) ^ (local_2d0 >> 0x12 | local_2d0 << 0x2e) ^
            (local_2d0 >> 0x29 | local_2d0 * 0x800000)) +
            (local_2e0 ^ local_2d0 & (local_2d8 ^ local_2e0)) + round_key[local_2e4 + 7] +
            (&uStack_298)[local_2e4 + 7];
    local_2c8 = lVar2 + local_2c8;
    local_2a8 = lVar2 + ((local_2b0 >> 0x1c | local_2b0 << 0x24) ^
                         (local_2b0 >> 0x22 | local_2b0 * 0x40000000) ^
                        (local_2b0 >> 0x27 | local_2b0 * 0x2000000)) +
                ((local_2b0 | local_2b8) & local_2c0 | local_2b0 & local_2b8);
  }
  *local_8 = local_2a8 + *local_8;
  local_8[1] = local_2b0 + local_8[1];
  local_8[2] = local_2b8 + local_8[2];
  local_8[3] = local_2c0 + local_8[3];
  local_8[4] = local_2c8 + local_8[4];
  local_8[5] = local_2d0 + local_8[5];
  local_8[6] = local_2d8 + local_8[6];
  local_8[7] = local_2e0 + local_8[7];
  return;
}

Assistant:

static void
compress(uint64_t state[8], const uint8_t buf[SHA512_BLOCK_SIZE])
{
	uint64_t W[80], t;
	uint64_t a, b, c, d, e, f, g, h;
	int i;

	a = state[0];
	b = state[1];
	c = state[2];
	d = state[3];
	e = state[4];
	f = state[5];
	g = state[6];
	h = state[7];

	for (i = 0; i < 16; i++)
		W[i] = load_be64(buf+8*i);

	for (i = 16; i < 80; i++)
		W[i] = W[i-16] + G0(W[i-15]) + W[i-7] + G1(W[i-2]);

	for (i = 0; i < 80; i += 8) {
		ROUND(i+0, a,b,c,d,e,f,g,h);
		ROUND(i+1, h,a,b,c,d,e,f,g);
		ROUND(i+2, g,h,a,b,c,d,e,f);
		ROUND(i+3, f,g,h,a,b,c,d,e);
		ROUND(i+4, e,f,g,h,a,b,c,d);
		ROUND(i+5, d,e,f,g,h,a,b,c);
		ROUND(i+6, c,d,e,f,g,h,a,b);
		ROUND(i+7, b,c,d,e,f,g,h,a);
	}

	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
	state[4] += e;
	state[5] += f;
	state[6] += g;
	state[7] += h;
}